

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O2

void __thiscall L10_2::Stock::sell(Stock *this,long num,double price)

{
  long lVar1;
  
  if (num < 0) {
    std::operator<<((ostream *)&std::cout,
                    "Number of shares sold can\'t be negative. Transaction is aborted.\n");
  }
  lVar1 = this->shares - num;
  if (this->shares < num) {
    std::operator<<((ostream *)&std::cout,
                    "Cannot sell more than you have! Transaction is aborted.\n");
  }
  this->shares = lVar1;
  this->share_val = price;
  this->total_val = (double)lVar1 * price;
  return;
}

Assistant:

void L10_2::Stock::sell(long num, double price) {
    using namespace std;
    if (num < 0) {
        cout << "Number of shares sold can't be negative. Transaction is aborted.\n";
    } else if (num > shares) {
        cout << "Cannot sell more than you have! Transaction is aborted.\n";
    } else {
        shares -= num;
        share_val = price;
        set_tot();
    }
}